

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_set_cursor(_Bool v)

{
  bool bVar1;
  uint local_c;
  _Bool v_local;
  
  bVar1 = (_Bool)(Term->scr->cv & 1U) != v;
  if (bVar1) {
    Term->scr->cv = v;
  }
  local_c = (uint)!bVar1;
  return local_c;
}

Assistant:

errr Term_set_cursor(bool v)
{
	/* Already done */
	if (Term->scr->cv == v) return (1);

	/* Change */
	Term->scr->cv = v;

	/* Success */
	return (0);
}